

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_stack_fffffffffffff700;
  allocator<char> *in_stack_fffffffffffff710;
  char *in_stack_fffffffffffff718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff720;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_fffffffffffff730;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_fffffffffffff770;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
  uVar1 = Hash(in_stack_fffffffffffff700);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x16a6836);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend(in_stack_fffffffffffff770);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::ClassId(in_stack_fffffffffffff730);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::~TPZGeoBlend
            ((TPZGeoBlend<pzgeom::TPZGeoTriangle> *)0x16a6883);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}